

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O0

void fill_in_New_Menu(void)

{
  Fl_Pixmap *ic;
  int iVar1;
  Fl_Menu_Item *this;
  void *pvVar2;
  long *plVar3;
  char *txt;
  char *local_28;
  char *n;
  Fl_Type *t;
  Fl_Menu_Item *m;
  uint i;
  
  for (m._4_4_ = 0; m._4_4_ < 0x45; m._4_4_ = m._4_4_ + 1) {
    this = New_Menu + m._4_4_;
    pvVar2 = Fl_Menu_Item::user_data(this);
    if (pvVar2 != (void *)0x0) {
      plVar3 = (long *)Fl_Menu_Item::user_data(this);
      if (this->text == (char *)0x0) {
        local_28 = (char *)(**(code **)(*plVar3 + 0x28))();
        iVar1 = strncmp(local_28,"Fl_",3);
        if (iVar1 == 0) {
          local_28 = local_28 + 3;
        }
        iVar1 = strncmp(local_28,"fltk::",6);
        if (iVar1 == 0) {
          local_28 = local_28 + 6;
        }
        iVar1 = (**(code **)(*plVar3 + 0x140))();
        make_iconlabel(this,&pixmap[iVar1]->super_Fl_Image,local_28);
      }
      else {
        iVar1 = (**(code **)(*plVar3 + 0x140))();
        ic = pixmap[iVar1];
        txt = Fl_Menu_Item::label(this);
        make_iconlabel(this,&ic->super_Fl_Image,txt);
      }
    }
  }
  return;
}

Assistant:

void fill_in_New_Menu() {
  for (unsigned i = 0; i < sizeof(New_Menu)/sizeof(*New_Menu); i++) {
    Fl_Menu_Item *m = New_Menu+i;
    if (m->user_data()) {
      Fl_Type *t = (Fl_Type*)m->user_data();
      if (m->text) {
        make_iconlabel( m, pixmap[t->pixmapID()], m->label() );
      } else {
        const char *n = t->type_name();
        if (!strncmp(n,"Fl_",3)) n += 3;
        if (!strncmp(n,"fltk::",6)) n += 6;
        make_iconlabel( m, pixmap[t->pixmapID()], n );
      }
    }
  }
}